

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

btVector3 operator-(btVector3 *v)

{
  btVector3 bVar1;
  
  bVar1.m_floats._0_8_ = *(ulong *)v->m_floats ^ 0x8000000080000000;
  bVar1.m_floats[2] = -v->m_floats[2];
  bVar1.m_floats[3] = 0.0;
  return (btVector3)bVar1.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE))
	__m128 r = _mm_xor_ps(v.mVec128, btvMzeroMask);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	return btVector3((btSimdFloat4)veorq_s32((int32x4_t)v.mVec128, (int32x4_t)btvMzeroMask));
#else
	return btVector3(-v.m_floats[0], -v.m_floats[1], -v.m_floats[2]);
#endif
}